

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

void mod2sparse_mulvec(mod2sparse *m,char *u,char *v)

{
  int iVar1;
  int iVar2;
  int j;
  int i;
  int N;
  int M;
  mod2entry *e;
  char *v_local;
  char *u_local;
  mod2sparse *m_local;
  
  iVar1 = m->n_rows;
  iVar2 = m->n_cols;
  for (i = 0; i < iVar1; i = i + 1) {
    v[i] = '\0';
  }
  for (j = 0; j < iVar2; j = j + 1) {
    if (u[j] != '\0') {
      for (e = m->cols[j].down; -1 < e->row; e = e->down) {
        v[e->row] = v[e->row] ^ 1;
      }
    }
  }
  return;
}

Assistant:

void mod2sparse_mulvec
( mod2sparse *m,	/* The sparse matrix, with M rows and N columns */
  char *u,		/* The input vector, N long */
  char *v		/* Place to store the result, M long */
)
{
  mod2entry *e;
  int M, N;
  int i, j;

  M = mod2sparse_rows(m);
  N = mod2sparse_cols(m);

  for (i = 0; i<M; i++) v[i] = 0;

  for (j = 0; j<N; j++)
  { if (u[j])
    { for (e = mod2sparse_first_in_col(m,j);
           !mod2sparse_at_end(e);
           e = mod2sparse_next_in_col(e))
      { v[mod2sparse_row(e)] ^= 1;
      }
    }
  }
}